

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

bool __thiscall
Js::JITPageAddrToFuncRangeCache::IsNativeAddr(JITPageAddrToFuncRangeCache *this,void *address)

{
  long lVar1;
  void *pvVar2;
  LargeJITFuncAddrToSizeMap *pLVar3;
  Type pSVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  void *local_30;
  void *pageAddr;
  RangeMap *rangeMap;
  
  CCLock::Enter((CCLock *)&cs);
  local_30 = (void *)(ulong)((uint)address & 0xfffff000);
  pageAddr = (void *)0x0;
  if ((this->jitPageAddrToFuncRangeMap != (JITPageAddrToFuncRangeMap *)0x0) &&
     (bVar5 = JsUtil::
              BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetValue<void*>
                        ((BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)this->jitPageAddrToFuncRangeMap,&local_30,
                         (BaseDictionary<void_*,_unsigned_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          **)&pageAddr), bVar5)) {
    uVar6 = (ulong)*(uint *)((long)pageAddr + 0x1c);
    bVar5 = uVar6 != 0;
    if (bVar5) {
      lVar1 = *(long *)((long)pageAddr + 8);
      bVar5 = true;
      uVar7 = 0;
      do {
        iVar9 = *(int *)(*pageAddr + uVar7 * 4);
        if (iVar9 != -1) {
          while (iVar9 != -1) {
            lVar10 = (long)iVar9 * 0x10;
            iVar9 = *(int *)(lVar1 + 4 + lVar10);
            pvVar2 = *(void **)(lVar1 + 8 + lVar10);
            if ((pvVar2 <= address) &&
               (address < (void *)((ulong)*(uint *)(lVar1 + lVar10) + (long)pvVar2)))
            goto LAB_0079c5c6;
          }
        }
        uVar7 = uVar7 + 1;
        bVar5 = uVar7 < uVar6;
      } while (uVar7 != uVar6);
    }
LAB_0079c5c6:
    bVar11 = true;
    if (bVar5) goto LAB_0079c631;
  }
  pLVar3 = this->largeJitFuncToSizeMap;
  if (pLVar3 == (LargeJITFuncAddrToSizeMap *)0x0) {
    bVar11 = false;
  }
  else {
    uVar6 = (ulong)pLVar3->bucketCount;
    bVar11 = uVar6 != 0;
    if (bVar11) {
      pSVar4 = pLVar3->entries;
      bVar11 = true;
      uVar7 = 0;
      do {
        iVar9 = pLVar3->buckets[uVar7];
        if (pLVar3->buckets[uVar7] != -1) {
          while (iVar8 = iVar9, iVar8 != -1) {
            iVar9 = pSVar4[iVar8].
                    super_DefaultHashedEntry<void_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<void_*,_unsigned_int>.
                    super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_int>_>
                    .super_KeyValueEntryDataLayout2<void_*,_unsigned_int>.next;
            pvVar2 = pSVar4[iVar8].
                     super_DefaultHashedEntry<void_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<void_*,_unsigned_int>.
                     super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_int>_>
                     .super_KeyValueEntryDataLayout2<void_*,_unsigned_int>.key;
            if ((pvVar2 <= address) &&
               (address < (void *)((ulong)pSVar4[iVar8].
                                          super_DefaultHashedEntry<void_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                          .super_KeyValueEntry<void_*,_unsigned_int>.
                                          super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<void_*,_unsigned_int>_>
                                          .super_KeyValueEntryDataLayout2<void_*,_unsigned_int>.
                                          value + (long)pvVar2))) goto LAB_0079c631;
          }
        }
        uVar7 = uVar7 + 1;
        bVar11 = uVar7 < uVar6;
      } while (uVar7 != uVar6);
    }
  }
LAB_0079c631:
  CCLock::Leave((CCLock *)&cs);
  return bVar11;
}

Assistant:

bool JITPageAddrToFuncRangeCache::IsNativeAddr(void * address)
    {
        AutoCriticalSection autocs(GetCriticalSection());

        void * pageAddr = GetPageAddr(address);
        RangeMap * rangeMap = nullptr;
        if (jitPageAddrToFuncRangeMap && jitPageAddrToFuncRangeMap->TryGetValue(pageAddr, &rangeMap))
        {
            if (rangeMap->MapUntil(
                [&](void* key, uint value) {
                return (key <= address && (uintptr_t)address < ((uintptr_t)key + value));
            }))
            {
                return true;
            }
        }

        return largeJitFuncToSizeMap && largeJitFuncToSizeMap->MapUntil(
            [&](void *key, uint value) {
            return (key <= address && (uintptr_t)address < ((uintptr_t)key + value));
        });
    }